

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Gia_ManBalance_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int v;
  Gia_Obj_t *pGVar5;
  Bal_Man_t *p_00;
  Vec_Int_t *pVVar6;
  int *pLits;
  Gia_Obj_t *pTemp;
  int iEnd;
  int iBeg;
  int iLit;
  int i;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  if (pObj->Value == 0xffffffff) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                    ,0x370,"void Gia_ManBalance_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Gia_ObjIsMux(p,pObj);
    if (iVar1 == 0) {
      Gia_ManSuperCollect(p,pObj);
      if (p->vStore == (Vec_Int_t *)0x0) {
        pVVar6 = Vec_IntAlloc(1000);
        p->vStore = pVVar6;
      }
      iVar1 = Vec_IntSize(p->vStore);
      Vec_IntAppend(p->vStore,p->vSuper);
      iVar2 = Vec_IntSize(p->vStore);
      for (iBeg = iVar1; iBeg < iVar2; iBeg = iBeg + 1) {
        iVar3 = Vec_IntEntry(p->vStore,iBeg);
        v = Abc_Lit2Var(iVar3);
        pGVar5 = Gia_ManObj(p,v);
        Gia_ManBalance_rec(pNew,p,pGVar5);
        pVVar6 = p->vStore;
        uVar4 = pGVar5->Value;
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar3 = Abc_LitNotCond(uVar4,iVar3);
        Vec_IntWriteEntry(pVVar6,iBeg,iVar3);
      }
      iVar3 = Vec_IntSize(p->vStore);
      if (iVar3 != iVar2) {
        __assert_fail("Vec_IntSize(p->vStore) == iEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                      ,0x38b,"void Gia_ManBalance_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
      }
      pVVar6 = p->vSuper;
      pLits = Vec_IntEntryP(p->vStore,iVar1);
      uVar4 = Gia_ManBalanceGate(pNew,pObj,pVVar6,pLits,iVar2 - iVar1);
      pObj->Value = uVar4;
      Vec_IntShrink(p->vStore,iVar1);
    }
    else {
      pGVar5 = Gia_ObjFanin0(pObj);
      Gia_ManBalance_rec(pNew,p,pGVar5);
      pGVar5 = Gia_ObjFanin1(pObj);
      Gia_ManBalance_rec(pNew,p,pGVar5);
      pGVar5 = Gia_ObjFanin2(p,pObj);
      Gia_ManBalance_rec(pNew,p,pGVar5);
      iVar1 = Gia_ObjFanin2Copy(p,pObj);
      iVar2 = Gia_ObjFanin1Copy(pObj);
      iVar3 = Gia_ObjFanin0Copy(pObj);
      uVar4 = Gia_ManHashMuxReal(pNew,iVar1,iVar2,iVar3);
      pObj->Value = uVar4;
      p_00 = Bal_GiaMan(pNew);
      Bal_ManSetGateLevel(p_00,pObj,pObj->Value);
    }
  }
  return;
}

Assistant:

void Gia_ManBalance_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
    int i, iLit, iBeg, iEnd;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjIsBuf(pObj) );
    // handle MUX
    if ( Gia_ObjIsMux(p, pObj) )
    {
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin0(pObj), fStrict );
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin1(pObj), fStrict );
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin2(p, pObj), fStrict );
        pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
        return;
    }
    // find supergate
    Gia_ManSuperCollect( p, pObj, fStrict );
    // save entries
    if ( p->vStore == NULL )
        p->vStore = Vec_IntAlloc( 1000 );
    iBeg = Vec_IntSize( p->vStore );
    Vec_IntAppend( p->vStore, p->vSuper );
    iEnd = Vec_IntSize( p->vStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vStore, iLit, i, iBeg, iEnd )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        Gia_ManBalance_rec( pNew, p, pTemp, fStrict );
        Vec_IntWriteEntry( p->vStore, i, Abc_LitNotCond(pTemp->Value, Abc_LitIsCompl(iLit)) );
    }
    assert( Vec_IntSize(p->vStore) == iEnd );
    // consider general case
    pObj->Value = Gia_ManBalanceGate( pNew, pObj, p->vSuper, Vec_IntEntryP(p->vStore, iBeg), iEnd-iBeg );
    Vec_IntShrink( p->vStore, iBeg );
}